

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void freeArray(Array a)

{
  element *peVar1;
  element *last;
  element *el;
  Array a_local;
  
  last = a->head;
  while (last != (element *)0x0) {
    peVar1 = last->next;
    deepFreeData(last->data);
    free(last);
    last = peVar1;
  }
  free(a);
  return;
}

Assistant:

void freeArray(Array a) {
    struct element *el = a->head, *last;
    while (el) {
        last = el;
        el = el->next;
        deepFreeData(last->data);
        free(last);
    }
    free(a);
}